

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O3

char TagChar(w3Tag t)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,t);
  if (iVar1 < 0x40) {
    if (iVar1 == 0) {
      return 'n';
    }
    if (iVar1 == 1) {
      return 'b';
    }
    if (iVar1 == 2) {
      return 'a';
    }
  }
  else {
    switch(iVar1) {
    case 0x70:
      return 'u';
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
    case 0x7b:
      break;
    case 0x7c:
      return 'g';
    case 0x7d:
      return 'f';
    case 0x7e:
      return 'j';
    case 0x7f:
      return 'i';
    case 0x80:
      return 'v';
    case 0x81:
      return 'L';
    case 0x82:
      return 'r';
    default:
      if (iVar1 == 0x40) {
        return 'e';
      }
    }
  }
  return '$';
}

Assistant:

char TagChar(w3Tag t) //todo: short string?
{
    switch (t)
    {
    case Tag_none: return 'n';
    case Tag_bool: return 'b';
    case Tag_any: return 'a';
    //case Tag_i8: return 'c';
    //case Tag_u8: return 'd';
    //case Tag_i16: return 's';
    //case Tag_u16: return 't';
    case Tag_i32: return 'i';
    case Tag_i64: return 'j';
    case Tag_f32: return 'f';
    case Tag_f64: return 'g';
    case Tag_empty: return 'e';
    case Tag_Value: return 'v';
    case Tag_Label: return 'L';
    case Tag_Frame: return 'r';
    case Tag_FuncRef: return 'u';
    }
    return '$';
}